

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_save.c
# Opt level: O0

ssize_t mpt_queue_save(mpt_queue *queue,int file)

{
  size_t sVar1;
  int __count;
  ssize_t len;
  iovec io [2];
  int file_local;
  mpt_queue *queue_local;
  
  sVar1 = queue->len;
  if (sVar1 == 0) {
    queue_local = (mpt_queue *)0x0;
  }
  else {
    len = (ssize_t)mpt_queue_data(queue,(size_t *)io);
    if ((void *)len == (void *)0x0) {
      queue_local = (mpt_queue *)0xfffffffffffffff0;
    }
    else {
      io[0].iov_len = (size_t)queue->base;
      io[1].iov_base = (void *)(sVar1 - (long)io[0].iov_base);
      __count = 1;
      if (io[1].iov_base != (void *)0x0) {
        __count = 2;
      }
      queue_local = (mpt_queue *)writev(file,(iovec *)&len,__count);
      if (0 < (long)queue_local) {
        mpt_queue_crop(queue,0,(size_t)queue_local);
      }
    }
  }
  return (ssize_t)queue_local;
}

Assistant:

extern ssize_t mpt_queue_save(MPT_STRUCT(queue) *queue, int file)
{
	struct iovec io[2];
	ssize_t len;
	
	if (!(len = queue->len)) {
		return 0;
	}
	/* get used parts */
	if (!(io[0].iov_base = mpt_queue_data(queue, &io[0].iov_len))) {
		return MPT_ERROR(MissingData);
	}
	/* prepare upper data part */
	io[1].iov_base = queue->base;
	io[1].iov_len  = len = len - io[0].iov_len;
	
	/* write queue buffer data to file */
	if ((len = writev(file, io, len ? 2 : 1)) <= 0) {
		return len;
	}
	/* remove written data from queue */
	mpt_queue_crop(queue, 0, len);
	
	return len;
}